

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_detections.c
# Opt level: O0

char * kws_detections_hyp_str(kws_detections_t *detections,int frame,int delay)

{
  undefined8 *puVar1;
  void *__src;
  size_t sVar2;
  glist_t pgVar3;
  undefined1 *puVar4;
  kws_detection_t *det_1;
  kws_detection_t *det;
  char *hyp_str;
  kws_detections_t *pkStack_30;
  int len;
  char *c;
  gnode_t *gn;
  int delay_local;
  int frame_local;
  kws_detections_t *detections_local;
  
  hyp_str._4_4_ = 0;
  for (c = (char *)detections->detect_list; c != (char *)0x0; c = *(char **)(c + 8)) {
    if (*(int *)((long)*(undefined8 **)c + 0xc) < frame - delay) {
      sVar2 = strlen((char *)**(undefined8 **)c);
      hyp_str._4_4_ = hyp_str._4_4_ + (int)sVar2 + 1;
    }
  }
  if (hyp_str._4_4_ == 0) {
    detections_local = (kws_detections_t *)0x0;
  }
  else {
    detections_local =
         (kws_detections_t *)
         __ckd_calloc__((long)hyp_str._4_4_,1,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_detections.c"
                        ,0x67);
    pgVar3 = glist_reverse(detections->detect_list);
    detections->detect_list = pgVar3;
    pkStack_30 = detections_local;
    for (c = (char *)detections->detect_list; c != (char *)0x0; c = *(char **)(c + 8)) {
      puVar1 = *(undefined8 **)c;
      if (*(int *)((long)puVar1 + 0xc) < frame - delay) {
        __src = (void *)*puVar1;
        sVar2 = strlen((char *)*puVar1);
        memcpy(pkStack_30,__src,sVar2);
        sVar2 = strlen((char *)*puVar1);
        puVar4 = (undefined1 *)((long)&pkStack_30->detect_list + sVar2);
        *puVar4 = 0x20;
        pkStack_30 = (kws_detections_t *)(puVar4 + 1);
      }
    }
    if (detections_local < pkStack_30) {
      *(undefined1 *)((long)&pkStack_30[-1].detect_list + 7) = 0;
    }
    pgVar3 = glist_reverse(detections->detect_list);
    detections->detect_list = pgVar3;
  }
  return (char *)detections_local;
}

Assistant:

char *
kws_detections_hyp_str(kws_detections_t *detections, int frame, int delay)
{
    gnode_t *gn;
    char *c;
    int len;
    char *hyp_str;

    len = 0;
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
	kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
	if (det->ef < frame - delay) {
	    len += strlen(det->keyphrase) + 1;
	}
    }

    if (len == 0) {
        return NULL;
    }

    hyp_str = (char *)ckd_calloc(len, sizeof(char));
    c = hyp_str;
    detections->detect_list = glist_reverse(detections->detect_list);
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
	kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
	if (det->ef < frame - delay) {
            memcpy(c, det->keyphrase, strlen(det->keyphrase));
    	    c += strlen(det->keyphrase);
    	    *c = ' ';
    	    c++;
    	}
    }
    if (c > hyp_str) {
        c--;
	*c = '\0';
    }
    detections->detect_list = glist_reverse(detections->detect_list);
    return hyp_str;
}